

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ustring.cpp
# Opt level: O2

int32_t u_strncmp_63(UChar *s1,UChar *s2,int32_t n)

{
  int iVar1;
  long lVar2;
  
  if (n < 1) {
LAB_00355c53:
    iVar1 = 0;
  }
  else {
    lVar2 = 0;
    while ((iVar1 = (uint)(ushort)s1[lVar2] - (uint)(ushort)s2[lVar2], s1[lVar2] != L'\0' &&
           (iVar1 == 0))) {
      if (n + -1 == (int)lVar2) goto LAB_00355c53;
      lVar2 = lVar2 + 1;
    }
  }
  return iVar1;
}

Assistant:

U_CAPI int32_t   U_EXPORT2
u_strncmp(const UChar     *s1, 
     const UChar     *s2, 
     int32_t     n) 
{
    if(n > 0) {
        int32_t rc;
        for(;;) {
            rc = (int32_t)*s1 - (int32_t)*s2;
            if(rc != 0 || *s1 == 0 || --n == 0) {
                return rc;
            }
            ++s1;
            ++s2;
        }
    } else {
        return 0;
    }
}